

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O0

int parse_limit(wasmbox_input_stream_t *ins,wasmbox_limit_t *limit)

{
  wasm_u8_t wVar1;
  wasm_u64_t wVar2;
  wasm_u8_t has_upper_limit;
  wasmbox_limit_t *limit_local;
  wasmbox_input_stream_t *ins_local;
  
  wVar1 = wasmbox_input_stream_read_u8(ins);
  wVar2 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
  limit->min = (wasm_u32_t)wVar2;
  if (wVar1 == '\0') {
    limit->max = 0xffffffff;
  }
  else {
    wVar2 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
    limit->max = (wasm_u32_t)wVar2;
  }
  return 0;
}

Assistant:

static int parse_limit(wasmbox_input_stream_t *ins, wasmbox_limit_t *limit) {
  wasm_u8_t has_upper_limit = wasmbox_input_stream_read_u8(ins);
  limit->min = wasmbox_parse_unsigned_leb128(ins->data + ins->index,
                                             &ins->index, ins->length);
  if (has_upper_limit) {
    limit->max = wasmbox_parse_unsigned_leb128(ins->data + ins->index,
                                               &ins->index, ins->length);
  } else {
    limit->max = WASM_U32_MAX;
  }
  return 0;
}